

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestErrors::TextureViewTestErrors(TextureViewTestErrors *this,Context *context)

{
  Context *context_local;
  TextureViewTestErrors *this_local;
  
  deqp::TestCase::TestCase(&this->super_TestCase,context,"errors","test_description");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureViewTestErrors_0324b688;
  this->m_bo_id = 0;
  this->m_reference_immutable_to_1d_id = 0;
  this->m_reference_immutable_to_2d_id = 0;
  this->m_reference_immutable_to_2d_array_id = 0;
  this->m_reference_immutable_to_2d_array_32_by_33_id = 0;
  this->m_reference_immutable_to_2d_multisample_id = 0;
  this->m_reference_immutable_to_3d_id = 0;
  this->m_reference_immutable_to_cube_map_id = 0;
  this->m_reference_immutable_to_cube_map_array_id = 0;
  this->m_reference_immutable_to_rectangle_id = 0;
  this->m_reference_mutable_to_2d_id = 0;
  this->m_test_modified_to_id_1 = 0;
  this->m_test_modified_to_id_2 = 0;
  this->m_test_modified_to_id_3 = 0;
  this->m_view_bound_to_id = 0;
  this->m_view_never_bound_to_id = 0;
  return;
}

Assistant:

TextureViewTestErrors::TextureViewTestErrors(deqp::Context& context)
	: TestCase(context, "errors", "test_description")
	, m_bo_id(0)
	, m_reference_immutable_to_1d_id(0)
	, m_reference_immutable_to_2d_id(0)
	, m_reference_immutable_to_2d_array_id(0)
	, m_reference_immutable_to_2d_array_32_by_33_id(0)
	, m_reference_immutable_to_2d_multisample_id(0)
	, m_reference_immutable_to_3d_id(0)
	, m_reference_immutable_to_cube_map_id(0)
	, m_reference_immutable_to_cube_map_array_id(0)
	, m_reference_immutable_to_rectangle_id(0)
	, m_reference_mutable_to_2d_id(0)
	, m_test_modified_to_id_1(0)
	, m_test_modified_to_id_2(0)
	, m_test_modified_to_id_3(0)
	, m_view_bound_to_id(0)
	, m_view_never_bound_to_id(0)
{
	/* Left blank on purpose */
}